

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_ssl_associate_conn(Curl_easy *data,connectdata *conn)

{
  if (Curl_ssl->associate_connection != (_func__Bool_Curl_easy_ptr_connectdata_ptr_int *)0x0) {
    (*Curl_ssl->associate_connection)(data,conn,0);
    if ((conn->sock[1] != -1) && (((conn->bits).field_0x7 & 0x20) != 0)) {
      (*Curl_ssl->associate_connection)(data,conn,1);
      return;
    }
  }
  return;
}

Assistant:

void Curl_ssl_associate_conn(struct Curl_easy *data,
                             struct connectdata *conn)
{
  if(Curl_ssl->associate_connection) {
    Curl_ssl->associate_connection(data, conn, FIRSTSOCKET);
    if((conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) &&
       conn->bits.sock_accepted)
      Curl_ssl->associate_connection(data, conn, SECONDARYSOCKET);
  }
}